

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O1

void __thiscall
QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
          (QPDFNumberTreeObjectHelper *this,QPDFObjectHandle *oh,QPDF *q,bool auto_repair)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Members *this_01;
  
  peVar1 = (oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
      (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
           (_func_int **)&PTR__QPDFObjectHelper_002f1ce8;
      (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      goto LAB_001bdf1f;
    }
  }
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFObjectHelper_002f1ce8;
  (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001bdf1f:
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFNumberTreeObjectHelper_002f1880;
  this_01 = (Members *)operator_new(0x10);
  Members::Members(this_01,oh,q,auto_repair);
  (this->m).super___shared_ptr<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFNumberTreeObjectHelper::Members*>
            (&(this->m).
              super___shared_ptr<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_01);
  return;
}

Assistant:

QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper(
    QPDFObjectHandle oh, QPDF& q, bool auto_repair) :
    QPDFObjectHelper(oh),
    m(new Members(oh, q, auto_repair))
{
}